

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void JS_FreeCString(JSContext *ctx,char *ptr)

{
  int iVar1;
  JSRuntime *pJVar2;
  JSAtomStruct *pJVar3;
  JSAtomStruct **ppJVar4;
  ulong uVar5;
  uint uVar6;
  JSAtomStruct *pJVar7;
  JSAtomStruct *pJVar8;
  
  if ((ptr != (char *)0x0) &&
     (iVar1 = *(int *)(ptr + -0x10), *(int *)(ptr + -0x10) = iVar1 + -1, iVar1 < 2)) {
    pJVar2 = ctx->rt;
    pJVar7 = (JSAtomStruct *)(ptr + -0x10);
    if (*(ulong *)(ptr + -0xc) >> 0x3e == 0) {
      (*(pJVar2->mf).js_free)(&pJVar2->malloc_state,pJVar7);
      return;
    }
    uVar6 = (uint)((ulong)*(undefined8 *)(ptr + -0xc) >> 0x20);
    if (uVar6 >> 0x1e < 3) {
      uVar6 = pJVar2->atom_hash_size - 1U & uVar6;
      uVar5 = (ulong)*(uint *)((long)pJVar2->atom_hash + (ulong)(uVar6 * 4));
      ppJVar4 = pJVar2->atom_array;
      pJVar3 = ppJVar4[uVar5];
      if (pJVar3 == pJVar7) {
        pJVar2->atom_hash[uVar6 & 0x3fffffff] = pJVar3->hash_next;
      }
      else {
        do {
          pJVar8 = pJVar3;
          uVar5 = (ulong)pJVar8->hash_next;
          pJVar3 = ppJVar4[uVar5];
        } while (pJVar3 != pJVar7);
        pJVar8->hash_next = pJVar3->hash_next;
      }
    }
    else {
      uVar5 = (ulong)*(uint *)(ptr + -4);
      ppJVar4 = pJVar2->atom_array;
    }
    ppJVar4[uVar5] = (JSAtomStruct *)((ulong)(uint)pJVar2->atom_free_index * 2 + 1);
    pJVar2->atom_free_index = (int)uVar5;
    (*(pJVar2->mf).js_free)(&pJVar2->malloc_state,pJVar7);
    pJVar2->atom_count = pJVar2->atom_count + -1;
    return;
  }
  return;
}

Assistant:

void JS_FreeCString(JSContext *ctx, const char *ptr)
{
    JSString *p;
    if (!ptr)
        return;
    /* purposely removing constness */
    p = (JSString *)(void *)(ptr - offsetof(JSString, u));
    JS_FreeValue(ctx, JS_MKPTR(JS_TAG_STRING, p));
}